

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::ResetLineState(FlowBuffer *this)

{
  LineBreakStyle LVar1;
  
  LVar1 = this->linebreak_style_;
  if (LVar1 != CR_OR_LF) {
    if (LVar1 != STRICT_CRLF) {
      return;
    }
    LVar1 = CR_LF_NUL;
  }
  this->state_ = LVar1;
  return;
}

Assistant:

void FlowBuffer::ResetLineState()
	{
	switch ( linebreak_style_ )
		{
		case CR_OR_LF:
			state_ = CR_OR_LF_0;
			break;
		case STRICT_CRLF:
			state_ = STRICT_CRLF_0;
			break;
		case LINE_BREAKER:
			break; // Nothing to reset
		default:
			BINPAC_ASSERT(0);
			break;
		}
	}